

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  FadExpr<FadFuncCos<Fad<double>_>_> *pFVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pFVar3 = (this->left_->fadexpr_).expr_;
  pdVar4 = &(pFVar3->fadexpr_).expr_.defaultVal;
  if ((pFVar3->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar4 = (pFVar3->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  dVar1 = *pdVar4;
  dVar5 = sin((pFVar3->fadexpr_).expr_.val_);
  dVar6 = cos((this->right_->fadexpr_).expr_.val_);
  pFVar3 = this->right_;
  pdVar4 = &(pFVar3->fadexpr_).expr_.defaultVal;
  if ((pFVar3->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar4 = (pFVar3->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  dVar2 = *pdVar4;
  dVar7 = sin((pFVar3->fadexpr_).expr_.val_);
  dVar8 = cos((((this->left_->fadexpr_).expr_)->fadexpr_).expr_.val_);
  return dVar8 * dVar7 * dVar2 + dVar6 * dVar5 * dVar1;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}